

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O1

bool __thiscall Imf_3_4::IDManifest::merge(IDManifest *this,IDManifest *other)

{
  pointer pCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  uint64_t idValue;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  ulong uVar10;
  pointer pCVar11;
  bool bVar12;
  
  if ((other->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (other->_manifest).
      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar12 = false;
  }
  else {
    bVar12 = false;
    uVar9 = 0;
    do {
      pCVar11 = (this->_manifest).
                super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_manifest).
          super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
          ._M_impl.super__Vector_impl_data._M_finish == pCVar11) {
        bVar4 = false;
      }
      else {
        uVar10 = 0;
        bVar4 = false;
        do {
          pCVar1 = (other->_manifest).
                   super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pCVar11[uVar10]._channels._M_t._M_impl.super__Rb_tree_header._M_node_count ==
               *(size_t *)((long)&pCVar1[uVar9]._channels._M_t + 0x28)) &&
             (bVar2 = std::__equal<false>::
                      equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                                (pCVar11[uVar10]._channels._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_left,
                                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )&pCVar11[uVar10]._channels._M_t._M_impl.super__Rb_tree_header,
                                 *(_Base_ptr *)((long)&pCVar1[uVar9]._channels._M_t + 0x18)), bVar2)
             ) {
            pCVar11 = (other->_manifest).
                      super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar1 = (this->_manifest).
                     super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __first1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        &pCVar11[uVar9]._components.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            __last1 = *(pointer *)
                       ((long)&pCVar11[uVar9]._components.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       + 8);
            __first2 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        &pCVar1[uVar10]._components.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            bVar4 = true;
            if (((long)__last1 - (long)__first1 ==
                 (long)*(pointer *)
                        ((long)&pCVar1[uVar10]._components.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        + 8) - (long)__first2) &&
               (bVar2 = std::__equal<false>::
                        equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                  (__first1,__last1,__first2), bVar2)) {
              pCVar11 = (other->_manifest).
                        super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              p_Var6 = *(_Base_ptr *)((long)&pCVar11[uVar9]._table._M_t + 0x18);
              if (p_Var6 != (_Base_ptr)((long)&pCVar11[uVar9]._table._M_t + 8U)) {
                do {
                  pCVar11 = (this->_manifest).
                            super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  idValue = *(uint64_t *)(p_Var6 + 1);
                  p_Var5 = (_Base_ptr)((long)&pCVar11[uVar10]._table._M_t + 8);
                  p_Var7 = p_Var5;
                  for (p_Var8 = *(_Base_ptr *)((long)&pCVar11[uVar10]._table._M_t + 0x10);
                      p_Var8 != (_Base_ptr)0x0;
                      p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < idValue]) {
                    if (*(ulong *)(p_Var8 + 1) >= idValue) {
                      p_Var7 = p_Var8;
                    }
                  }
                  p_Var8 = p_Var5;
                  if ((p_Var7 != p_Var5) && (p_Var8 = p_Var7, idValue < *(ulong *)(p_Var7 + 1))) {
                    p_Var8 = p_Var5;
                  }
                  if (p_Var8 == p_Var5) {
                    ChannelGroupManifest::insert
                              (pCVar11 + uVar10,idValue,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&p_Var6[1]._M_parent);
                    bVar2 = bVar12;
                  }
                  else {
                    bVar2 = true;
                    if (((long)*(_Base_ptr *)((long)(p_Var8 + 1) + 0x10) -
                         (long)*(_Base_ptr *)((long)(p_Var8 + 1) + 8) ==
                         (long)p_Var6[1]._M_left - (long)p_Var6[1]._M_parent) &&
                       (bVar3 = std::__equal<false>::
                                equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)*(_Base_ptr *)((long)(p_Var8 + 1) + 8),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)*(_Base_ptr *)((long)(p_Var8 + 1) + 0x10),
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)p_Var6[1]._M_parent), bVar2 = bVar12, !bVar3)) {
                      bVar2 = true;
                    }
                  }
                  bVar12 = bVar2;
                  p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                } while (p_Var6 != (_Rb_tree_node_base *)
                                   ((long)&(other->_manifest).
                                           super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar9]._table.
                                           _M_t + 8U));
              }
            }
            else {
              bVar12 = true;
            }
          }
          uVar10 = uVar10 + 1;
          pCVar11 = (this->_manifest).
                    super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)(((long)(this->_manifest).
                                         super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar11
                                  >> 4) * 0x4ec4ec4ec4ec4ec5));
      }
      if (!bVar4) {
        std::
        vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
        ::push_back(&this->_manifest,
                    (other->_manifest).
                    super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar9);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(((long)(other->_manifest).
                                    super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(other->_manifest).
                                    super__Vector_base<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x4ec4ec4ec4ec4ec5));
  }
  return bVar12;
}

Assistant:

bool
IDManifest::merge (const IDManifest& other)
{
    bool conflict = false;
    for (size_t otherManifest = 0; otherManifest < other._manifest.size ();
         ++otherManifest)
    {
        bool merged = false;
        for (size_t thisManifest = 0; thisManifest < _manifest.size ();
             ++thisManifest)
        {
            if (_manifest[thisManifest]._channels ==
                other._manifest[otherManifest]._channels)
            {
                // found same channels

                merged = true;

                if (other._manifest[otherManifest]._components !=
                    _manifest[thisManifest]._components)
                {
                    // cannot merge if components are different
                    conflict = true;
                }
                else
                {

                    //                    if(other._manifest[otherManifest]._encodingScheme !=  _manifest[thisManifest]._encodingScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._hashScheme !=  _manifest[thisManifest]._hashScheme ||
                    //                        other._manifest[otherManifest]._lifeTime !=  _manifest[thisManifest]._lifeTime)
                    //                    {
                    //                        conflict = true;
                    //                    }

                    for (IDManifest::ChannelGroupManifest::ConstIterator it =
                             other._manifest[otherManifest].begin ();
                         it != other._manifest[otherManifest].end ();
                         ++it)
                    {
                        IDManifest::ChannelGroupManifest::ConstIterator ours =
                            _manifest[thisManifest].find (it.id ());
                        if (ours == _manifest[thisManifest].end ())
                        {
                            _manifest[thisManifest].insert (
                                it.id (), it.text ());
                        }
                        else
                        {
                            if (ours.text () != it.text ()) { conflict = true; }
                        }
                    }
                }
            }
        }

        if (!merged) { _manifest.push_back (other._manifest[otherManifest]); }
    }

    return conflict;
}